

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

bool pstore::http::check_message_complete<WsServer_Ping_Test::TestBody()::__2,int>
               (anon_class_8_1_65350a3f sender,int io,frame *wsp,opcode *op,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *payload)

{
  int io_00;
  uint uVar1;
  bool bVar2;
  anon_class_8_1_65350a3f sender_00;
  anon_class_8_1_65350a3f sender_01;
  span<const_unsigned_char,__1L> *in_R9;
  error_code eVar3;
  byte local_e5;
  error_code local_d8;
  string local_c8;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_a8;
  span<unsigned_char_const,_1l> local_98 [16];
  http *local_88;
  undefined1 local_80 [8];
  error_or<int> eo3;
  error_or<int> local_60;
  uchar *local_48;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *payload_local;
  opcode *op_local;
  frame *wsp_local;
  anon_class_8_1_65350a3f aStack_18;
  int io_local;
  anon_class_8_1_65350a3f sender_local;
  
  if ((wsp->fin & 1U) != 0) {
    local_e5 = 0;
    local_38 = payload;
    payload_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)op;
    op_local = &wsp->op;
    wsp_local._4_4_ = io;
    aStack_18.output = sender.output;
    if (*op == text) {
      local_40._M_current =
           (uchar *)std::begin<std::vector<unsigned_char,std::allocator<unsigned_char>>>(payload);
      local_48 = (uchar *)std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    (local_38);
      bVar2 = is_valid_utf8<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (local_40,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   )local_48);
      local_e5 = bVar2 ^ 0xff;
    }
    uVar1 = wsp_local._4_4_;
    if ((local_e5 & 1) != 0) {
      eo3._16_8_ = aStack_18.output;
      sender_00.output._4_4_ = 0;
      sender_00.output._0_4_ = wsp_local._4_4_;
      send_close_frame<WsServer_Ping_Test::TestBody()::__2,int>
                (&local_60,(http *)aStack_18.output,sender_00,0x3ef,(close_status_code)payload);
      error_or<int>::~error_or(&local_60);
      return false;
    }
    local_88 = (http *)aStack_18.output;
    io_00 = *(int *)&(payload_local->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    local_a8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         (local_38);
    pstore::gsl::span<unsigned_char_const,-1l>::span<unsigned_char,_1l>
              (local_98,(span<unsigned_char,__1L> *)&local_a8);
    sender_01.output._4_4_ = 0;
    sender_01.output._0_4_ = uVar1;
    send_message<WsServer_Ping_Test::TestBody()::__2,int>
              ((error_or<int> *)local_80,local_88,sender_01,io_00,(opcode)local_98,in_R9);
    bVar2 = pstore::error_or::operator_cast_to_bool((error_or *)local_80);
    if (!bVar2) {
      eVar3 = error_or<int>::get_error((error_or<int> *)local_80);
      local_d8._M_cat = eVar3._M_cat;
      local_d8._M_value = eVar3._M_value;
      std::error_code::message_abi_cxx11_(&local_c8,&local_d8);
      log<std::__cxx11::string>(error,"Send error: ",&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(local_38);
    *(undefined4 *)
     &(payload_local->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start = 0xff;
    error_or<int>::~error_or((error_or<int> *)local_80);
  }
  return true;
}

Assistant:

bool check_message_complete (Sender const sender, IO const io, frame const & wsp,
                                     opcode & op, std::vector<std::uint8_t> & payload) {
            if (wsp.fin) {
                // We've got the complete message. If this was a text message, we need to
                // validate the UTF-8 that it contains.
                //
                // "When an endpoint is to interpret a byte stream as UTF-8 but finds that
                // the byte stream is not, in fact, a valid UTF-8 stream, that endpoint MUST
                // _Fail the WebSocket Connection_.
                if (op == opcode::text &&
                    !is_valid_utf8 (std::begin (payload), std::end (payload))) {

                    send_close_frame (sender, io, close_status_code::invalid_payload);
                    return false;
                }

                if (log_received_messages) {
                    std::string str;
                    std::transform (std::begin (payload), std::end (payload),
                                    std::back_inserter (str),
                                    [] (std::uint8_t const v) { return static_cast<char> (v); });
                    log (logger::priority::info, "Received: ", str);
                }

                // This implements a simple echo server ATM.
                error_or<IO> const eo3 = send_message (sender, io, op, gsl::make_span (payload));
                if (!eo3) {
                    log (logger::priority::error, "Send error: ", eo3.get_error ().message ());
                }

                payload.clear ();
                op = opcode::unknown;
            }
            return true;
        }